

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O1

map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
* dominac_frontier(map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                   *__return_storage_ptr__,
                  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *dom,
                  map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                  *nodes)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr __k;
  int iVar2;
  _Base_ptr p_Var3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  ulong uVar7;
  _Rb_tree_header *p_Var8;
  int runner;
  vector<int,_std::allocator<int>_> b;
  _Self __tmp;
  int local_7c;
  vector<int,_std::allocator<int>_> local_78;
  map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  *local_60;
  _Base_ptr local_58;
  _Base_ptr local_50;
  _Base_ptr local_48;
  _Base_ptr local_40;
  ulong local_38;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48 = (dom->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_50 = &(dom->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (local_48 != local_50) {
    local_58 = &(nodes->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_60 = nodes;
    do {
      p_Var6 = (local_60->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var3 = local_58;
      if (p_Var6 != (_Base_ptr)0x0) {
        do {
          if ((int)local_48[1]._M_color <= (int)p_Var6[1]._M_color) {
            p_Var3 = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < (int)local_48[1]._M_color];
        } while (p_Var6 != (_Base_ptr)0x0);
      }
      p_Var6 = local_58;
      if ((p_Var3 != local_58) &&
         (p_Var6 = p_Var3, (int)local_48[1]._M_color < (int)p_Var3[1]._M_color)) {
        p_Var6 = local_58;
      }
      if ((8 < (ulong)(*(long *)(p_Var6[1]._M_parent + 2) - (long)p_Var6[1]._M_parent[1]._M_right))
         && (p_Var3 = p_Var6[1]._M_parent[1]._M_right,
            *(_Base_ptr *)(p_Var6[1]._M_parent + 2) != p_Var3)) {
        __k = p_Var6 + 1;
        uVar7 = 0;
        local_40 = p_Var6;
        do {
          local_7c = **(int **)(&p_Var3->_M_color + uVar7 * 2);
          local_38 = uVar7;
          pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   operator[](dom,(key_type *)__k);
          iVar2 = *pmVar4;
          while (local_7c != iVar2) {
            p_Var6 = (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header.
                     _M_parent;
            p_Var3 = &p_Var1->_M_header;
            for (; (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0;
                p_Var6 = (&p_Var6->_M_left)[(int)*(size_t *)(p_Var6 + 1) < local_7c]) {
              if (local_7c <= (int)*(size_t *)(p_Var6 + 1)) {
                p_Var3 = p_Var6;
              }
            }
            p_Var8 = p_Var1;
            if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
               (p_Var8 = (_Rb_tree_header *)p_Var3,
               local_7c < (int)((_Rb_tree_header *)p_Var3)->_M_node_count)) {
              p_Var8 = p_Var1;
            }
            if (p_Var8 == p_Var1) {
              local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start = (pointer)0x0;
              local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish = (int *)0x0;
              local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage = (int *)0x0;
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_78,(iterator)0x0,(int *)__k);
              pmVar5 = std::
                       map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ::operator[](__return_storage_ptr__,&local_7c);
              std::vector<int,_std::allocator<int>_>::operator=(pmVar5,&local_78);
            }
            else {
              std::vector<int,_std::allocator<int>_>::vector
                        (&local_78,(vector<int,_std::allocator<int>_> *)(p_Var8 + 1));
              if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_78,
                           (iterator)
                           local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)__k);
              }
              else {
                *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = __k->_M_color;
                local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              pmVar5 = std::
                       map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ::operator[](__return_storage_ptr__,&local_7c);
              std::vector<int,_std::allocator<int>_>::operator=(pmVar5,&local_78);
            }
            if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[](dom,&local_7c);
            local_7c = *pmVar4;
          }
          uVar7 = local_38 + 1;
          p_Var3 = local_40[1]._M_parent[1]._M_right;
        } while (uVar7 < (ulong)(*(long *)(local_40[1]._M_parent + 2) - (long)p_Var3 >> 3));
      }
      local_48 = (_Base_ptr)std::_Rb_tree_increment(local_48);
    } while (local_48 != local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

map<int, vector<int>> dominac_frontier(map<int, int> dom,
                                       map<int, BasicBlock*> nodes) {
  map<int, vector<int>> dom_f;
  map<int, int>::iterator iter;
  for (iter = dom.begin(); iter != dom.end(); iter++) {
    map<int, BasicBlock*>::iterator it = nodes.find(iter->first);
    if (it->second->preBlock.size() > 1) {
      for (int i = 0; i < it->second->preBlock.size(); i++) {
        int runner = it->second->preBlock[i]->id;
        map<int, vector<int>>::iterator itt;
        int idom_b = dom[it->first];
        while (runner != idom_b) {
          // add b to runner's dominance frontier set
          itt = dom_f.find(runner);
          if (itt == dom_f.end()) {
            vector<int> b;
            b.push_back(it->first);
            dom_f[runner] = b;
          } else {
            vector<int> b = itt->second;
            b.push_back(it->first);
            dom_f[runner] = b;
          }
          // runner := idom(runner)
          runner = dom[runner];
        }
      }
    }
  }
  map<int, vector<int>>::iterator i;
  /*cout << endl << "*** desplay dominac frontier ***" << endl;
  for (i = dom_f.begin(); i != dom_f.end(); i++) {
      cout << i->first;
      for (int j = 0; j < i->second.size(); j++) {
          cout << " " << i->second[j];
      }
      cout << endl;
  }*/
  return dom_f;
}